

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

string_view
slang::ast::SemanticFacts::getTypeRestrictionText(ForwardTypeRestriction typeRestriction)

{
  char *__str;
  int in_EDI;
  string_view sVar1;
  size_t in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  __str = (char *)(ulong)(in_EDI - 1);
  switch(__str) {
  case (char *)0x0:
    local_10 = sv(__str,in_stack_ffffffffffffffd8);
    break;
  case (char *)0x1:
    local_10 = sv(__str,in_stack_ffffffffffffffd8);
    break;
  case (char *)0x2:
    local_10 = sv(__str,in_stack_ffffffffffffffd8);
    break;
  case (char *)0x3:
    local_10 = sv(__str,in_stack_ffffffffffffffd8);
    break;
  case (char *)0x4:
    local_10 = sv(__str,in_stack_ffffffffffffffd8);
    break;
  default:
    local_10 = sv(__str,in_stack_ffffffffffffffd8);
  }
  sVar1._M_len = local_10._M_len;
  sVar1._M_str = local_10._M_str;
  return sVar1;
}

Assistant:

std::string_view SemanticFacts::getTypeRestrictionText(ForwardTypeRestriction typeRestriction) {
    switch (typeRestriction) {
        case ForwardTypeRestriction::Enum:
            return "enum"sv;
        case ForwardTypeRestriction::Struct:
            return "struct"sv;
        case ForwardTypeRestriction::Union:
            return "union"sv;
        case ForwardTypeRestriction::Class:
            return "class"sv;
        case ForwardTypeRestriction::InterfaceClass:
            return "interface class"sv;
        default:
            return ""sv;
    }
}